

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

void __thiscall DPlayerMenu::SkinChanged(DPlayerMenu *this,FListMenuItem *li)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  FListMenuItem *pFVar4;
  int sel;
  uint local_20;
  FName local_1c;
  
  if (((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x1c8] & 0x20) == 0) {
    puVar1 = (undefined8 *)
             ((ulong)(((&DAT_017e5e98)[(long)consoleplayer * 0xa8] - 1 & 0x23c) * 0x18) +
             (&DAT_017e5e88)[(long)consoleplayer * 0x54]);
    do {
      puVar3 = puVar1;
      puVar1 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x23c);
    if (*(int *)(puVar3[2] + 0x28) != -1) {
      iVar2 = (*li->_vptr_FListMenuItem[0xb])(li,0,&local_20);
      if ((char)iVar2 != '\0') {
        local_20 = (this->PlayerSkins).Array[(int)local_20];
        userinfo_t::SkinNumChanged
                  ((userinfo_t *)(&DAT_017e5e88 + (long)consoleplayer * 0x54),local_20);
        UpdateTranslation(this);
        cvar_set("skin",skins[(int)local_20].name);
        local_1c.Index = 0x20c;
        pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_1c);
        if (pFVar4 != (FListMenuItem *)0x0) {
          (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0x10002,(ulong)local_20);
        }
      }
    }
  }
  return;
}

Assistant:

void DPlayerMenu::SkinChanged (FListMenuItem *li)
{
	if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
		players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
	{
		return;
	}

	int	sel;

	if (li->GetValue(0, &sel))
	{
		sel = PlayerSkins[sel];
		players[consoleplayer].userinfo.SkinNumChanged(sel);
		UpdateTranslation();
		cvar_set ("skin", skins[sel].name);

		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, sel);
		}
	}
}